

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::TaskSet::Task> * __thiscall
kj::Own<kj::TaskSet::Task>::operator=(Own<kj::TaskSet::Task> *this,Own<kj::TaskSet::Task> *other)

{
  Disposer *this_00;
  Task *object;
  Task *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::TaskSet::Task> *other_local;
  Own<kj::TaskSet::Task> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (Task *)0x0;
  if (object != (Task *)0x0) {
    Disposer::dispose<kj::TaskSet::Task>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }